

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomenv.cpp
# Opt level: O0

void anon_unknown.dwarf_41c2c8::AddSockaddr(CSHA512 *hasher,sockaddr *addr)

{
  short *in_RSI;
  uchar *in_RDI;
  long in_FS_OFFSET;
  CSHA512 *this;
  
  this = *(CSHA512 **)(in_FS_OFFSET + 0x28);
  if (in_RSI != (short *)0x0) {
    if (*in_RSI == 2) {
      CSHA512::Write(this,in_RDI,(size_t)in_RSI);
    }
    else if (*in_RSI == 10) {
      CSHA512::Write(this,in_RDI,(size_t)in_RSI);
    }
    else {
      CSHA512::Write(this,in_RDI,(size_t)in_RSI);
    }
  }
  if (*(CSHA512 **)(in_FS_OFFSET + 0x28) != this) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddSockaddr(CSHA512& hasher, const struct sockaddr *addr)
{
    if (addr == nullptr) return;
    switch (addr->sa_family) {
    case AF_INET:
        hasher.Write((const unsigned char*)addr, sizeof(sockaddr_in));
        break;
    case AF_INET6:
        hasher.Write((const unsigned char*)addr, sizeof(sockaddr_in6));
        break;
    default:
        hasher.Write((const unsigned char*)&addr->sa_family, sizeof(addr->sa_family));
    }
}